

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

IterationResult __thiscall helics::FederateState::waitSetup(FederateState *this)

{
  bool bVar1;
  FederateStates FVar2;
  FederateState *in_RDI;
  IterationResult ret;
  lock_guard<helics::FederateState> fedlock;
  MessageProcessingResult ret_1;
  FederateState *in_stack_00000168;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 local_21;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 local_1;
  
  bVar1 = try_lock(in_RDI);
  if (bVar1) {
    local_1 = processQueue(in_stack_00000168);
    unlock(in_RDI);
  }
  else {
    std::lock_guard<helics::FederateState>::lock_guard
              ((lock_guard<helics::FederateState> *)in_RDI,
               (mutex_type *)
               CONCAT17(in_stack_ffffffffffffffbf,
                        CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
    FVar2 = getState((FederateState *)0x58ba1c);
    if (FVar2 == CREATED) {
      local_1 = waitSetup((FederateState *)
                          CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    }
    else {
      if (FVar2 == ERRORED) {
        local_21 = ERROR_RESULT;
      }
      else if (FVar2 == FINISHED) {
        local_21 = HALTED;
      }
      else {
        local_21 = NEXT_STEP;
      }
      local_1 = local_21;
    }
    std::lock_guard<helics::FederateState>::~lock_guard
              ((lock_guard<helics::FederateState> *)0x58baa5);
  }
  return local_1;
}

Assistant:

IterationResult FederateState::waitSetup()
{
    if (try_lock()) {  // only enter this loop once per federate
        auto ret = processQueue();
        unlock();
        return static_cast<IterationResult>(ret);
    }
    // this function can fail try_lock gracefully

    const std::lock_guard<FederateState> fedlock(*this);
    IterationResult ret;
    switch (getState()) {
        case FederateStates::CREATED: {  // we are still in the created state
            return waitSetup();
        }
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        default:
            ret = IterationResult::NEXT_STEP;
            break;
    }

    return ret;
}